

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

void __thiscall catalog::writeBacktoFile(catalog *this)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  reference ppTVar3;
  int local_220;
  int i;
  ofstream local_210 [8];
  ofstream tablelist;
  catalog *this_local;
  
  if ((this->anychangeornot & 1U) != 0) {
    _Var1 = std::operator|(_S_out,_S_bin);
    _Var1 = std::operator|(_Var1,_S_trunc);
    std::ofstream::ofstream(local_210,"./file/catalog/table.dat",_Var1);
    std::ostream::write((char *)local_210,(long)&this->tableNumber);
    for (local_220 = 0; local_220 < this->tableNumber; local_220 = local_220 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"writing back table  -------------------------"
                              );
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_220);
      poVar2 = std::operator<<(poVar2,(string *)*ppTVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_220);
      writeTabletoFile(this,*ppTVar3,local_210);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_210);
  }
  return;
}

Assistant:

void catalog::writeBacktoFile(){
    if(anychangeornot){
        std::ofstream tablelist("./file/catalog/table.dat", std::ios::out | std::ios::binary | std::ios::trunc);
        tablelist.write(reinterpret_cast<char*>(&tableNumber), sizeof(int));
        for(int i = 0 ; i < tableNumber ; i++){
            std::cout<<"writing back table  -------------------------"<<TableInfoList[i]->tableName<<std::endl;
            writeTabletoFile(TableInfoList[i],tablelist);
        }
        tablelist.close();
    }
    return;
}